

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

bool __thiscall
c4::yml::Parser::_location_from_node(Parser *this,Tree *tree,size_t node,Location *loc,size_t level)

{
  code *pcVar1;
  Location LVar2;
  undefined1 auVar3 [24];
  Location LVar4;
  Location LVar5;
  bool bVar6;
  undefined1 uVar7;
  csubstr *pcVar8;
  char *pcVar9;
  pfn_error p_Var10;
  NodeType NVar11;
  size_t sVar12;
  size_t sVar13;
  void *pvVar14;
  char *val;
  uint uVar15;
  char msg [32];
  Location local_108;
  size_t local_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  char *pcStack_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  char *pcStack_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  char *pcStack_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  char *pcStack_40;
  undefined8 local_38;
  
  local_d8 = level;
  if ((node == 0xffffffffffffffff) || (tree->m_cap <= node)) {
    if ((((byte)s_error_flags & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
      pcVar1 = (code *)swi(3);
      uVar7 = (*pcVar1)();
      return (bool)uVar7;
    }
    local_108.super_LineCol.offset = 0;
    local_108.super_LineCol.line = 0x4b86;
    local_108.super_LineCol.col = 0;
    local_108.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_108.name.len = 0x65;
    (*(code *)PTR_error_impl_0023c518)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
  }
  if ((tree->m_buf[node].m_type.type & KEY) == NOTYPE) {
LAB_001e4c95:
    if ((node == 0xffffffffffffffff) || (tree->m_cap <= node)) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
        pcVar1 = (code *)swi(3);
        uVar7 = (*pcVar1)();
        return (bool)uVar7;
      }
      local_108.super_LineCol.offset = 0;
      local_108.super_LineCol.line = 0x4b86;
      local_108.super_LineCol.col = 0;
      local_108.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_108.name.len = 0x65;
      (*(code *)PTR_error_impl_0023c518)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    if ((tree->m_buf[node].m_type.type & VAL) != NOTYPE) {
      pcVar8 = Tree::val(tree,node);
      val = pcVar8->str;
      if (val != (char *)0x0) {
        sVar12 = pcVar8->len;
        pcVar9 = (this->m_buf).str;
        sVar13 = (this->m_buf).len;
        if (sVar13 == 0) {
          if (pcVar9 == val && sVar12 == 0) goto LAB_001e512e;
LAB_001e4fc3:
          local_108.super_LineCol.col._0_1_ = '.';
          local_108.super_LineCol.col._1_1_ = 'i';
          local_108.super_LineCol.col._2_1_ = 's';
          local_108.super_LineCol.col._3_1_ = '_';
          local_108.super_LineCol.col._4_1_ = 's';
          local_108.super_LineCol.col._5_1_ = 'u';
          local_108.super_LineCol.col._6_1_ = 'b';
          local_108.super_LineCol.col._7_1_ = '(';
          local_108.name.str = (char *)0x29296675625f6d;
          local_108.super_LineCol.offset._0_1_ = 'c';
          local_108.super_LineCol.offset._1_1_ = 'h';
          local_108.super_LineCol.offset._2_1_ = 'e';
          local_108.super_LineCol.offset._3_1_ = 'c';
          local_108.super_LineCol.offset._4_1_ = 'k';
          local_108.super_LineCol.offset._5_1_ = ' ';
          local_108.super_LineCol.offset._6_1_ = 'f';
          local_108.super_LineCol.offset._7_1_ = 'a';
          local_108.super_LineCol.line._0_1_ = 'i';
          local_108.super_LineCol.line._1_1_ = 'l';
          local_108.super_LineCol.line._2_1_ = 'e';
          local_108.super_LineCol.line._3_1_ = 'd';
          local_108.super_LineCol.line._4_1_ = ':';
          local_108.super_LineCol.line._5_1_ = ' ';
          local_108.super_LineCol.line._6_1_ = '(';
          local_108.super_LineCol.line._7_1_ = 'v';
          if ((((byte)s_error_flags & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
            pcVar1 = (code *)swi(3);
            uVar7 = (*pcVar1)();
            return (bool)uVar7;
          }
          local_a8 = 0;
          uStack_a0 = 0x7fb4;
          local_98 = 0;
          pcStack_90 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_88 = 0x65;
          auVar3 = ZEXT1224(ZEXT412(0x7fb4) << 0x40);
          LVar4.name.str._0_4_ = 0x1fa88a;
          LVar4.super_LineCol.offset = auVar3._0_8_;
          LVar4.super_LineCol.line = auVar3._8_8_;
          LVar4.super_LineCol.col = auVar3._16_8_;
          LVar4.name.str._4_4_ = 0;
          LVar4.name.len = 0x65;
          (*(this->m_stack).m_callbacks.m_error)
                    ((char *)&local_108,0x20,LVar4,(this->m_stack).m_callbacks.m_user_data);
          pcVar9 = (this->m_buf).str;
          sVar13 = (this->m_buf).len;
          if (sVar13 != 0) goto LAB_001e5078;
          if (sVar12 == 0 && pcVar9 == val) goto LAB_001e512e;
        }
        else {
          if (val < pcVar9 || pcVar9 + sVar13 < val + sVar12) goto LAB_001e4fc3;
LAB_001e5078:
          if (pcVar9 <= val && val + sVar12 <= pcVar9 + sVar13) goto LAB_001e512e;
        }
        local_108.super_LineCol.col._0_1_ = '_';
        local_108.super_LineCol.col._1_1_ = 'b';
        local_108.super_LineCol.col._2_1_ = 'u';
        local_108.super_LineCol.col._3_1_ = 'f';
        local_108.super_LineCol.col._4_1_ = '.';
        local_108.super_LineCol.col._5_1_ = 'i';
        local_108.super_LineCol.col._6_1_ = 's';
        local_108.super_LineCol.col._7_1_ = '_';
        local_108.name.str = (char *)0x2976287265707573;
        local_108.super_LineCol.offset._0_1_ = 'c';
        local_108.super_LineCol.offset._1_1_ = 'h';
        local_108.super_LineCol.offset._2_1_ = 'e';
        local_108.super_LineCol.offset._3_1_ = 'c';
        local_108.super_LineCol.offset._4_1_ = 'k';
        local_108.super_LineCol.offset._5_1_ = ' ';
        local_108.super_LineCol.offset._6_1_ = 'f';
        local_108.super_LineCol.offset._7_1_ = 'a';
        local_108.super_LineCol.line._0_1_ = 'i';
        local_108.super_LineCol.line._1_1_ = 'l';
        local_108.super_LineCol.line._2_1_ = 'e';
        local_108.super_LineCol.line._3_1_ = 'd';
        local_108.super_LineCol.line._4_1_ = ':';
        local_108.super_LineCol.line._5_1_ = ' ';
        local_108.super_LineCol.line._6_1_ = '(';
        local_108.super_LineCol.line._7_1_ = 'm';
        local_108.name.len = CONCAT62(local_108.name.len._2_6_,0x29);
        if ((((byte)s_error_flags & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
          pcVar1 = (code *)swi(3);
          uVar7 = (*pcVar1)();
          return (bool)uVar7;
        }
        p_Var10 = (this->m_stack).m_callbacks.m_error;
        local_d0 = 0;
        uStack_c8 = 0x7fb5;
        local_c0 = 0;
        pcStack_b8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_b0 = 0x65;
        pvVar14 = (this->m_stack).m_callbacks.m_user_data;
        uStack_c8._0_4_ = 0x7fb5;
        uVar15 = (uint)uStack_c8;
LAB_001e5119:
        auVar3 = ZEXT424(uVar15) << 0x40;
        LVar5.name.str._0_4_ = 0x1fa88a;
        LVar5.super_LineCol.offset = auVar3._0_8_;
        LVar5.super_LineCol.line = auVar3._8_8_;
        LVar5.super_LineCol.col = auVar3._16_8_;
        LVar5.name.str._4_4_ = 0;
        LVar5.name.len = 0x65;
        (*p_Var10)((char *)&local_108,0x22,LVar5,pvVar14);
        goto LAB_001e512e;
      }
    }
    if ((node == 0xffffffffffffffff) || (tree->m_cap <= node)) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
        pcVar1 = (code *)swi(3);
        uVar7 = (*pcVar1)();
        return (bool)uVar7;
      }
      local_108.super_LineCol.offset = 0;
      local_108.super_LineCol.line = 0x4b86;
      local_108.super_LineCol.col = 0;
      local_108.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_108.name.len = 0x65;
      (*(code *)PTR_error_impl_0023c518)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    if ((tree->m_buf[node].m_type.type & (STREAM|MAP)) == NOTYPE) {
      NVar11 = Tree::type(tree,node);
      if (local_d8 != 0) {
        return false;
      }
      if (NVar11.type == NOTYPE) {
        return false;
      }
      sVar12 = Tree::prev_sibling(tree,node);
      if ((sVar12 != 0xffffffffffffffff) &&
         (bVar6 = _location_from_node(this,tree,sVar12,loc,1), bVar6)) {
        return true;
      }
      sVar12 = Tree::next_sibling(tree,node);
      if ((sVar12 != 0xffffffffffffffff) &&
         (bVar6 = _location_from_node(this,tree,sVar12,loc,1), bVar6)) {
        return true;
      }
      sVar12 = Tree::parent(tree,node);
      if ((sVar12 != 0xffffffffffffffff) &&
         (bVar6 = _location_from_node(this,tree,sVar12,loc,1), bVar6)) {
        return true;
      }
      return false;
    }
    _location_from_cont(this,tree,node,loc);
  }
  else {
    pcVar8 = Tree::key(tree,node);
    val = pcVar8->str;
    if (val == (char *)0x0) goto LAB_001e4c95;
    sVar12 = pcVar8->len;
    pcVar9 = (this->m_buf).str;
    sVar13 = (this->m_buf).len;
    if (sVar13 != 0) {
      if (val < pcVar9 || pcVar9 + sVar13 < val + sVar12) goto LAB_001e4e0f;
LAB_001e4ec4:
      if (pcVar9 <= val && val + sVar12 <= pcVar9 + sVar13) goto LAB_001e512e;
LAB_001e4ede:
      local_108.super_LineCol.col._0_1_ = '_';
      local_108.super_LineCol.col._1_1_ = 'b';
      local_108.super_LineCol.col._2_1_ = 'u';
      local_108.super_LineCol.col._3_1_ = 'f';
      local_108.super_LineCol.col._4_1_ = '.';
      local_108.super_LineCol.col._5_1_ = 'i';
      local_108.super_LineCol.col._6_1_ = 's';
      local_108.super_LineCol.col._7_1_ = '_';
      local_108.name.str = (char *)0x296b287265707573;
      local_108.super_LineCol.offset._0_1_ = 'c';
      local_108.super_LineCol.offset._1_1_ = 'h';
      local_108.super_LineCol.offset._2_1_ = 'e';
      local_108.super_LineCol.offset._3_1_ = 'c';
      local_108.super_LineCol.offset._4_1_ = 'k';
      local_108.super_LineCol.offset._5_1_ = ' ';
      local_108.super_LineCol.offset._6_1_ = 'f';
      local_108.super_LineCol.offset._7_1_ = 'a';
      local_108.super_LineCol.line._0_1_ = 'i';
      local_108.super_LineCol.line._1_1_ = 'l';
      local_108.super_LineCol.line._2_1_ = 'e';
      local_108.super_LineCol.line._3_1_ = 'd';
      local_108.super_LineCol.line._4_1_ = ':';
      local_108.super_LineCol.line._5_1_ = ' ';
      local_108.super_LineCol.line._6_1_ = '(';
      local_108.super_LineCol.line._7_1_ = 'm';
      local_108.name.len = CONCAT62(local_108.name.len._2_6_,0x29);
      if ((((byte)s_error_flags & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
        pcVar1 = (code *)swi(3);
        uVar7 = (*pcVar1)();
        return (bool)uVar7;
      }
      p_Var10 = (this->m_stack).m_callbacks.m_error;
      local_80 = 0;
      uStack_78 = 0x7fa9;
      local_70 = 0;
      pcStack_68 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_60 = 0x65;
      pvVar14 = (this->m_stack).m_callbacks.m_user_data;
      uStack_78._0_4_ = 0x7fa9;
      uVar15 = (uint)uStack_78;
      goto LAB_001e5119;
    }
    if (pcVar9 != val || sVar12 != 0) {
LAB_001e4e0f:
      local_108.super_LineCol.col._0_1_ = '.';
      local_108.super_LineCol.col._1_1_ = 'i';
      local_108.super_LineCol.col._2_1_ = 's';
      local_108.super_LineCol.col._3_1_ = '_';
      local_108.super_LineCol.col._4_1_ = 's';
      local_108.super_LineCol.col._5_1_ = 'u';
      local_108.super_LineCol.col._6_1_ = 'b';
      local_108.super_LineCol.col._7_1_ = '(';
      local_108.name.str = (char *)0x29296675625f6d;
      local_108.super_LineCol.offset._0_1_ = 'c';
      local_108.super_LineCol.offset._1_1_ = 'h';
      local_108.super_LineCol.offset._2_1_ = 'e';
      local_108.super_LineCol.offset._3_1_ = 'c';
      local_108.super_LineCol.offset._4_1_ = 'k';
      local_108.super_LineCol.offset._5_1_ = ' ';
      local_108.super_LineCol.offset._6_1_ = 'f';
      local_108.super_LineCol.offset._7_1_ = 'a';
      local_108.super_LineCol.line._0_1_ = 'i';
      local_108.super_LineCol.line._1_1_ = 'l';
      local_108.super_LineCol.line._2_1_ = 'e';
      local_108.super_LineCol.line._3_1_ = 'd';
      local_108.super_LineCol.line._4_1_ = ':';
      local_108.super_LineCol.line._5_1_ = ' ';
      local_108.super_LineCol.line._6_1_ = '(';
      local_108.super_LineCol.line._7_1_ = 'k';
      if ((((byte)s_error_flags & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
        pcVar1 = (code *)swi(3);
        uVar7 = (*pcVar1)();
        return (bool)uVar7;
      }
      local_58 = 0;
      uStack_50 = 0x7fa8;
      local_48 = 0;
      pcStack_40 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_38 = 0x65;
      auVar3 = ZEXT1224(ZEXT412(0x7fa8) << 0x40);
      LVar2.name.str._0_4_ = 0x1fa88a;
      LVar2.super_LineCol.offset = auVar3._0_8_;
      LVar2.super_LineCol.line = auVar3._8_8_;
      LVar2.super_LineCol.col = auVar3._16_8_;
      LVar2.name.str._4_4_ = 0;
      LVar2.name.len = 0x65;
      (*(this->m_stack).m_callbacks.m_error)
                ((char *)&local_108,0x20,LVar2,(this->m_stack).m_callbacks.m_user_data);
      pcVar9 = (this->m_buf).str;
      sVar13 = (this->m_buf).len;
      if (sVar13 != 0) goto LAB_001e4ec4;
      if (sVar12 == 0 && pcVar9 == val) goto LAB_001e512e;
      goto LAB_001e4ede;
    }
LAB_001e512e:
    val_location(&local_108,this,val);
    (loc->name).len = local_108.name.len;
    (loc->super_LineCol).col = local_108.super_LineCol.col;
    (loc->name).str = local_108.name.str;
    (loc->super_LineCol).offset = local_108.super_LineCol.offset;
    (loc->super_LineCol).line = local_108.super_LineCol.line;
  }
  return true;
}

Assistant:

bool Parser::_location_from_node(Tree const& tree, size_t node, Location *C4_RESTRICT loc, size_t level) const
{
    if(tree.has_key(node))
    {
        csubstr k = tree.key(node);
        if(C4_LIKELY(k.str != nullptr))
        {
            _RYML_CB_ASSERT(m_stack.m_callbacks, k.is_sub(m_buf));
            _RYML_CB_ASSERT(m_stack.m_callbacks, m_buf.is_super(k));
            *loc = val_location(k.str);
            return true;
        }
    }

    if(tree.has_val(node))
    {
        csubstr v = tree.val(node);
        if(C4_LIKELY(v.str != nullptr))
        {
            _RYML_CB_ASSERT(m_stack.m_callbacks, v.is_sub(m_buf));
            _RYML_CB_ASSERT(m_stack.m_callbacks, m_buf.is_super(v));
            *loc = val_location(v.str);
            return true;
        }
    }

    if(tree.is_container(node))
    {
        if(_location_from_cont(tree, node, loc))
            return true;
    }

    if(tree.type(node) != NOTYPE && level == 0)
    {
        // try the prev sibling
        {
            const size_t prev = tree.prev_sibling(node);
            if(prev != NONE)
            {
                if(_location_from_node(tree, prev, loc, level+1))
                    return true;
            }
        }
        // try the next sibling
        {
            const size_t next = tree.next_sibling(node);
            if(next != NONE)
            {
                if(_location_from_node(tree, next, loc, level+1))
                    return true;
            }
        }
        // try the parent
        {
            const size_t parent = tree.parent(node);
            if(parent != NONE)
            {
                if(_location_from_node(tree, parent, loc, level+1))
                    return true;
            }
        }
    }

    return false;
}